

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::
RepeatedImmutableStringFieldGenerator
          (RepeatedImmutableStringFieldGenerator *this,FieldDescriptor *descriptor,
          int messageBitIndex,int builderBitIndex,Context *context)

{
  ClassNameResolver *pCVar1;
  FieldGeneratorInfo *info;
  Context *context_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  RepeatedImmutableStringFieldGenerator *this_local;
  
  ImmutableFieldGenerator::ImmutableFieldGenerator(&this->super_ImmutableFieldGenerator);
  (this->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator =
       (_func_int **)&PTR__RepeatedImmutableStringFieldGenerator_008e8a30;
  this->descriptor_ = descriptor;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  anon_unknown_5::SetPrimitiveVariables
            (descriptor,messageBitIndex,builderBitIndex,info,this->name_resolver_,&this->variables_)
  ;
  return;
}

Assistant:

RepeatedImmutableStringFieldGenerator::RepeatedImmutableStringFieldGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  SetPrimitiveVariables(descriptor, messageBitIndex, builderBitIndex,
                        context->GetFieldGeneratorInfo(descriptor),
                        name_resolver_, &variables_);
}